

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O1

TestStatus *
vkt::pipeline::anon_unknown_0::SampledImage::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  void **this;
  int iVar1;
  VkSampleCountFlagBits VVar2;
  VkSubpassDescription *pVVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  undefined8 uVar5;
  bool bVar6;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  void *pvVar7;
  undefined8 commandBuffer;
  undefined8 uVar8;
  undefined8 uVar9;
  void *pvVar10;
  undefined8 uVar11;
  VkDeviceSize VVar12;
  deUint32 queueFamilyIndex;
  int iVar13;
  VkResult result;
  DeviceInterface *vk;
  InstanceInterface *vki;
  VkDevice device;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  TestLog *pTVar14;
  TextureFormat format;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  const_iterator cVar15;
  int iVar16;
  VkDeviceSize bufferSize;
  VkDeviceSize bufferSize_00;
  undefined4 uVar17;
  undefined1 local_658 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  long *local_630;
  long *local_628;
  long *local_620;
  TestStatus *local_618;
  Context *local_610;
  undefined1 local_608 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> vertices;
  VkAttachmentReference colorAttachmentRef;
  long local_5c0;
  long local_5b8 [2];
  Move<vk::Handle<(vk::HandleType)17>_> local_5a8;
  VkBufferCreateInfo bufferCreateInfo;
  ios_base local_510 [264];
  long local_408;
  long *plStack_400;
  VkBufferCreateFlags local_3f8;
  undefined4 uStack_3f4;
  VkDeviceSize VStack_3f0;
  VkImage local_3e8;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_3e0;
  VkAttachmentDescription colorAttachmentDescription;
  undefined4 uStack_3a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  VkRenderPass local_388;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_380;
  VkBuffer local_368;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_360;
  VkSubpassDescription *local_348;
  VkQueue local_340;
  VkDescriptorSetLayout local_338;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_330;
  VkBuffer local_318;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_310;
  VkImageSubresourceRange res_1;
  VkImageSubresourceRange res;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_2c0;
  VkShaderModule local_2a8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_2a0;
  VkDescriptorPool local_288;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_280;
  VkImageView local_268;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_260;
  VkSampler local_248;
  Deleter<vk::Handle<(vk::HandleType)20>_> DStack_240;
  VkImageView local_228;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_220;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipelines;
  VkDescriptorImageInfo imageDescriptorInfo;
  IVec2 local_1d0;
  undefined1 local_1c8 [8];
  pointer pVStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined8 local_1a8;
  VkSubpassDescription *local_1a0;
  deUint32 local_198;
  VkSubpassDependency *local_190;
  ios_base local_150 [264];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_618 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  vki = Context::getInstanceInterface(context);
  device = Context::getDevice(context);
  physDevice = Context::getPhysicalDevice(context);
  local_340 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  checkImageFormatRequirements(vki,physDevice,caseDef->numSamples,caseDef->colorFormat,0x14);
  pTVar14 = context->m_testCtx->m_log;
  local_658._0_8_ = &local_648;
  local_610 = context;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_658,"Description","");
  local_608._0_8_ = &local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"");
  tcu::LogSection::LogSection
            ((LogSection *)&colorAttachmentDescription,(string *)local_658,(string *)local_608);
  tcu::TestLog::startSection
            (pTVar14,(char *)colorAttachmentDescription._0_8_,
             (char *)CONCAT44(uStack_3a4,colorAttachmentDescription.finalLayout));
  local_1c8 = (undefined1  [8])pTVar14;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_1c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pVStack_1c0,
             "Rendering to a multisampled image. Expecting all samples to be either a clear color or a primitive color."
             ,0x69);
  bufferCreateInfo._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this = &bufferCreateInfo.pNext;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,"Sampling from the texture with texelFetch (OpImageFetch).",0x39);
  pTVar14 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&bufferCreateInfo,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::endSection(pTVar14);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base(local_510);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_1c0);
  std::ios_base::~ios_base(local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_3a4,colorAttachmentDescription.finalLayout) != &local_398) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_3a4,colorAttachmentDescription.finalLayout),
                    local_398._M_allocated_capacity + 1);
  }
  if ((VkAttachmentStoreOp *)colorAttachmentDescription._0_8_ != &colorAttachmentDescription.storeOp
     ) {
    operator_delete((void *)colorAttachmentDescription._0_8_,colorAttachmentDescription._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._0_8_ != &local_5f8) {
    operator_delete((void *)local_608._0_8_,local_5f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._0_8_ != &local_648) {
    operator_delete((void *)local_658._0_8_,local_648._M_allocated_capacity + 1);
  }
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&bufferCreateInfo,vk,device,caseDef->colorFormat
            ,&caseDef->renderSize,caseDef->numLayers,caseDef->numSamples,0x14);
  local_648._M_allocated_capacity = bufferCreateInfo._16_8_;
  local_648._8_8_ = bufferCreateInfo.size;
  local_658._0_8_ = bufferCreateInfo._0_8_;
  local_658._8_8_ = bufferCreateInfo.pNext;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
            device,allocator,(VkImage)bufferCreateInfo._0_8_,(MemoryRequirement)0x0);
  local_620 = (long *)bufferCreateInfo._0_8_;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,vk,device,2,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  local_5f8._M_allocated_capacity = bufferCreateInfo._16_8_;
  local_5f8._8_8_ = bufferCreateInfo.size;
  local_608._0_8_ = bufferCreateInfo._0_8_;
  local_608._8_8_ = bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,vk,device,
                    (VkCommandPool)bufferCreateInfo._0_8_);
  VVar12 = bufferCreateInfo.size;
  uVar11 = bufferCreateInfo._16_8_;
  pvVar10 = bufferCreateInfo.pNext;
  commandBuffer = bufferCreateInfo._0_8_;
  pVVar3 = *(VkSubpassDescription **)(caseDef->renderSize).m_data;
  renderMultisampledImage(local_610,caseDef,(VkImage)local_658._0_8_);
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = caseDef->numLayers;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&bufferCreateInfo,vk,device,
                (VkImage)local_658._0_8_,(uint)(caseDef->numLayers != 1) * 4 + VK_IMAGE_VIEW_TYPE_2D
                ,caseDef->colorFormat,subresourceRange);
  DStack_220.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_220.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_228.m_internal = bufferCreateInfo._0_8_;
  DStack_220.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.usage = 2;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_LAST;
  bufferCreateInfo.queueFamilyIndexCount = 2;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0x3f800000;
  ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)local_1c8,vk,device,
                      (VkSamplerCreateInfo *)&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  local_248.m_internal = (deUint64)local_1c8;
  DStack_240.m_deviceIface = (DeviceInterface *)pVStack_1c0;
  DStack_240.m_device = (VkDevice)local_1b8._M_allocated_capacity;
  DStack_240.m_allocator = (VkAllocationCallbacks *)local_1b8._8_8_;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&bufferCreateInfo,vk,device,VK_FORMAT_R32_SINT,
            &caseDef->renderSize,1,VK_SAMPLE_COUNT_1_BIT,0x11);
  DStack_3e0.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_3e0.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_3e8.m_internal = bufferCreateInfo._0_8_;
  DStack_3e0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
            device,allocator,(VkImage)bufferCreateInfo._0_8_,(MemoryRequirement)0x0);
  local_628 = (long *)bufferCreateInfo._0_8_;
  res_1.aspectMask = 1;
  res_1.baseMipLevel = 0;
  res_1.levelCount = 1;
  res_1.baseArrayLayer = 0;
  res_1.layerCount = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&bufferCreateInfo,vk,device,local_3e8,
                VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_SINT,subresourceRange_00);
  DStack_260.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_260.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_268.m_internal = bufferCreateInfo._0_8_;
  DStack_260.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  iVar1 = (caseDef->renderSize).m_data[1];
  iVar16 = (caseDef->renderSize).m_data[0];
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SINT);
  iVar13 = tcu::getPixelSize(format);
  iVar13 = iVar1 * iVar16 * iVar13;
  bufferSize = (VkDeviceSize)iVar13;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1c8,vk,device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  local_368.m_internal = (deUint64)local_1c8;
  DStack_360.m_deviceIface = (DeviceInterface *)pVStack_1c0;
  DStack_360.m_device = (VkDevice)local_1b8._M_allocated_capacity;
  DStack_360.m_allocator = (VkAllocationCallbacks *)local_1b8._8_8_;
  local_348 = pVVar3;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,(VkBuffer)local_1c8,(MemoryRequirement)0x1);
  uVar8 = bufferCreateInfo._0_8_;
  memset(*(void **)(bufferCreateInfo._0_8_ + 0x18),0,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar8 + 8),*(VkDeviceSize *)(uVar8 + 0x10),
             bufferSize);
  if (pipeline::(anonymous_namespace)::genFullQuadVertices()::data == '\0') {
    _GLOBAL__N_1::SampledImage::test();
  }
  std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
  vector<vkt::pipeline::Vertex4RGBA_const*,void>
            ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
             &vertices,(Vertex4RGBA *)pipeline::(anonymous_namespace)::genFullQuadVertices()::data,
             (Vertex4RGBA *)&pipeline::(anonymous_namespace)::genFullQuadVertices()::data,
             (allocator_type *)&bufferCreateInfo);
  bufferSize_00 =
       (long)vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)vertices.
             super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
             ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize_00,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_1c8,vk,device,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  local_318.m_internal = (deUint64)local_1c8;
  DStack_310.m_deviceIface = (DeviceInterface *)pVStack_1c0;
  DStack_310.m_device = (VkDevice)local_1b8._M_allocated_capacity;
  DStack_310.m_allocator = (VkAllocationCallbacks *)local_1b8._8_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,vk,
             device,allocator,(VkBuffer)local_1c8,(MemoryRequirement)0x1);
  uVar9 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         vertices.
         super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
         ._M_impl.super__Vector_impl_data._M_start,bufferSize_00);
  local_630 = (long *)uVar9;
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(uVar9 + 8),*(VkDeviceSize *)(uVar9 + 0x10),
             bufferSize_00);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&bufferCreateInfo);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&bufferCreateInfo,
                       VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1,0x10,&local_248);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)local_1c8,this_00,vk,device,0);
  DStack_330.m_device = (VkDevice)local_1b8._M_allocated_capacity;
  DStack_330.m_allocator = (VkAllocationCallbacks *)local_1b8._8_8_;
  local_338.m_internal = (deUint64)local_1c8;
  DStack_330.m_deviceIface = (DeviceInterface *)pVStack_1c0;
  local_1c8 = (undefined1  [8])0x0;
  pVStack_1c0 = (pointer)0x0;
  local_1b8._M_allocated_capacity = 0;
  local_1b8._8_8_ = (VkAllocationCallbacks *)0x0;
  pvVar7 = (void *)CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                            (int)bufferCreateInfo.pQueueFamilyIndices);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,-(long)pvVar7);
  }
  if (bufferCreateInfo.size != 0) {
    operator_delete((void *)bufferCreateInfo.size,
                    CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount) -
                    bufferCreateInfo.size);
  }
  if (bufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ - bufferCreateInfo._0_8_)
    ;
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_1c8);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)local_1c8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
                       1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&bufferCreateInfo,this_01,vk,device,1,1);
  DStack_280.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_280.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_288.m_internal = bufferCreateInfo._0_8_;
  DStack_280.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity - (long)local_1c8);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferCreateInfo,vk,device,local_288,
                    local_338);
  local_3f8 = bufferCreateInfo.flags;
  uStack_3f4 = bufferCreateInfo._20_4_;
  VStack_3f0 = bufferCreateInfo.size;
  local_408 = bufferCreateInfo._0_8_;
  plStack_400 = (long *)bufferCreateInfo.pNext;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&bufferCreateInfo);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&bufferCreateInfo,(VkStructureType)local_408,
                       (void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  pvVar7 = (void *)CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                            (int)bufferCreateInfo.pQueueFamilyIndices);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,-(long)pvVar7);
  }
  if (bufferCreateInfo.size != 0) {
    operator_delete((void *)bufferCreateInfo.size,
                    CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount) -
                    bufferCreateInfo.size);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&bufferCreateInfo);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)local_610->m_progCollection;
  local_1c8 = (undefined1  [8])&local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"sample_vert","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)local_1c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar15._M_node + 2),0);
  DStack_2a0.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_2a0.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_2a8.m_internal = bufferCreateInfo._0_8_;
  DStack_2a0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)local_610->m_progCollection;
  local_1c8 = (undefined1  [8])&local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"sample_frag","");
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)local_1c8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,vk,device,
             *(ProgramBinary **)(cVar15._M_node + 2),0);
  uVar9 = bufferCreateInfo._0_8_;
  DStack_2c0.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_2c0.m_allocator = (VkAllocationCallbacks *)bufferCreateInfo.size;
  DStack_2c0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0;
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
  colorAttachmentDescription.flags = 0;
  colorAttachmentDescription.format = VK_FORMAT_R32_SINT;
  colorAttachmentDescription.samples = VK_SAMPLE_COUNT_1_BIT;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentDescription.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  bufferCreateInfo._32_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.size = 1;
  local_1c8._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  pVStack_1c0 = (pointer)0x0;
  local_1b8._M_allocated_capacity = 0x100000000;
  local_1b8._8_8_ = &colorAttachmentDescription;
  local_1a8._0_4_ = 1;
  local_198 = 0;
  local_190 = (VkSubpassDependency *)0x0;
  local_1a0 = (VkSubpassDescription *)&bufferCreateInfo;
  ::vk::createRenderPass
            (&local_5a8,vk,device,(VkRenderPassCreateInfo *)local_1c8,(VkAllocationCallbacks *)0x0);
  local_388.m_internal =
       local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  DStack_380.m_deviceIface =
       local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  DStack_380.m_device =
       local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  DStack_380.m_allocator =
       local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&bufferCreateInfo,vk,device,
                  (VkRenderPass)
                  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,
                  1,&local_268,(caseDef->renderSize).m_data[0],(caseDef->renderSize).m_data[1],1);
  colorAttachmentDescription.storeOp = bufferCreateInfo.flags;
  colorAttachmentDescription.stencilLoadOp = bufferCreateInfo._20_4_;
  colorAttachmentDescription.stencilStoreOp = (undefined4)bufferCreateInfo.size;
  colorAttachmentDescription.initialLayout = bufferCreateInfo.size._4_4_;
  colorAttachmentDescription.flags = bufferCreateInfo.sType;
  colorAttachmentDescription.format = bufferCreateInfo._4_4_;
  colorAttachmentDescription._8_8_ = bufferCreateInfo.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,vk,device,local_338)
  ;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)bufferCreateInfo.size;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  local_1d0.m_data = *&(caseDef->renderSize).m_data;
  makeGraphicsPipelines
            (&pipelines,vk,device,1,(VkPipelineLayout)bufferCreateInfo._0_8_,local_388,local_2a8,
             (VkShaderModule)uVar9,&local_1d0,VK_SAMPLE_COUNT_1_BIT,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP);
  beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x100;
  bufferCreateInfo._20_4_ = 0x20;
  bufferCreateInfo.size = 0x500000002;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = (deUint32)local_658._0_8_;
  bufferCreateInfo._44_4_ = SUB84(local_658._0_8_,4);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x400,0x80,0,0,0,0,0,1,(int)&bufferCreateInfo)
  ;
  local_190 = (VkSubpassDependency *)&local_48;
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  uStack_40._0_4_ = 0;
  uStack_40._4_4_ = 0;
  local_1c8._0_4_ = 0x2b;
  pVStack_1c0 = (pointer)0x0;
  local_1b8._M_allocated_capacity = local_388.m_internal;
  local_1b8._8_4_ = colorAttachmentDescription.flags;
  local_1b8._12_4_ = colorAttachmentDescription.format;
  local_1a8 = 0;
  local_1a0 = local_348;
  local_198 = 1;
  (*vk->_vptr_DeviceInterface[0x74])(vk,commandBuffer,local_1c8,0);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,commandBuffer,0,
             ((pipelines.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
             super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,commandBuffer,0,
             local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal,0,1,
             (int)&local_408,0,0);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,commandBuffer,0,1);
  (*vk->_vptr_DeviceInterface[0x59])
            (vk,commandBuffer,
             (ulong)((long)vertices.
                           super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5,1);
  (*vk->_vptr_DeviceInterface[0x76])(vk,commandBuffer);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x100;
  bufferCreateInfo._20_4_ = 0x800;
  bufferCreateInfo.size = 0x600000002;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = (deUint32)local_3e8.m_internal;
  bufferCreateInfo._44_4_ = SUB84(local_3e8.m_internal >> 0x20,0);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  uVar17 = SUB84(&bufferCreateInfo,0);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x400,0x1000,0,0,0,0,0,1,uVar17);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 1;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size = 0x100000000;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  uVar5 = *(undefined8 *)(caseDef->renderSize).m_data;
  bufferCreateInfo._44_4_ = SUB84(uVar5,0);
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = (int)((ulong)uVar5 >> 0x20);
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 1;
  (*vk->_vptr_DeviceInterface[99])
            (vk,commandBuffer,local_3e8.m_internal,6,local_368.m_internal,1,uVar17);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x1000;
  bufferCreateInfo._20_4_ = 0x2000;
  bufferCreateInfo.size = 0xffffffffffffffff;
  bufferCreateInfo.usage = (undefined4)local_368.m_internal;
  bufferCreateInfo.sharingMode = local_368.m_internal._4_4_;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = iVar13 >> 0x1f;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = iVar13;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x1000,0x4000,0,0,0,1,uVar17,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,commandBuffer);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x465);
  submitCommandsAndWait(vk,device,local_340,(VkCommandBuffer)commandBuffer);
  ::vk::invalidateMappedMemoryRange(vk,device,(VkDeviceMemory)*(deUint64 *)(uVar8 + 8),0,bufferSize)
  ;
  colorAttachmentRef = (VkAttachmentReference)::vk::mapVkFormat(VK_FORMAT_R32_SINT);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&bufferCreateInfo,(TextureFormat *)&colorAttachmentRef,
             (caseDef->renderSize).m_data[0],(caseDef->renderSize).m_data[1],1,
             *(void **)(uVar8 + 0x18));
  iVar1 = (caseDef->renderSize).m_data[1];
  bVar6 = 0 < iVar1;
  if (0 < iVar1) {
    iVar1 = caseDef->numLayers;
    VVar2 = caseDef->numSamples;
    iVar16 = 0;
    do {
      if (0 < (caseDef->renderSize).m_data[0]) {
        iVar13 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&colorAttachmentRef,(int)&bufferCreateInfo,iVar13,
                     iVar16);
          if (colorAttachmentRef.attachment != iVar1 * VVar2) {
            colorAttachmentRef = (VkAttachmentReference)local_5b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&colorAttachmentRef,"Some samples have incorrect color","");
            local_618->m_code = QP_TEST_RESULT_FAIL;
            (local_618->m_description)._M_dataplus._M_p =
                 (pointer)&(local_618->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_618->m_description,colorAttachmentRef,
                       local_5c0 + (long)colorAttachmentRef);
            if (colorAttachmentRef != (VkAttachmentReference)local_5b8) {
              operator_delete((void *)colorAttachmentRef,local_5b8[0] + 1);
            }
            goto LAB_004cf03f;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (caseDef->renderSize).m_data[0]);
      }
      iVar16 = iVar16 + 1;
      iVar13 = (caseDef->renderSize).m_data[1];
      bVar6 = iVar16 < iVar13;
    } while (iVar16 < iVar13);
  }
LAB_004cf03f:
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipelines);
  if (local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)
               &local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkPipelineLayout)
               local_5a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  if (colorAttachmentDescription._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentDescription.samples,
               (VkFramebuffer)colorAttachmentDescription._0_8_);
  }
  if (local_388.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_380,local_388);
  }
  if (uVar9 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_2c0,(VkShaderModule)uVar9);
  }
  if (local_2a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_2a0,local_2a8);
  }
  if (local_408 != 0) {
    bufferCreateInfo._0_8_ = local_408;
    (**(code **)(*plStack_400 + 0x1e8))(plStack_400,_local_3f8,VStack_3f0,1);
  }
  if (local_288.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_280,local_288);
  }
  if (local_338.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_330,local_338);
  }
  if (local_630 != (long *)0x0) {
    (**(code **)(*local_630 + 8))();
  }
  if (local_318.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_310,local_318);
  }
  if (vertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (uVar8 != 0) {
    (**(code **)(*(long *)uVar8 + 8))(uVar8);
  }
  if (local_368.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_360,local_368);
  }
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_260,local_268);
  }
  if (local_628 != (long *)0x0) {
    (**(code **)(*local_628 + 8))();
  }
  if (local_3e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_3e0,local_3e8);
  }
  if (local_248.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()(&DStack_240,local_248);
  }
  if (local_228.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_220,local_228);
  }
  if (!bVar6) {
    bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"OK","");
    local_618->m_code = QP_TEST_RESULT_PASS;
    (local_618->m_description)._M_dataplus._M_p = (pointer)&(local_618->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_618->m_description,bufferCreateInfo._0_8_,
               (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
    if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
      operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
    }
  }
  if (commandBuffer != 0) {
    bufferCreateInfo._0_8_ = commandBuffer;
    (**(code **)(*pvVar10 + 0x240))(pvVar10,uVar11,VVar12,1);
  }
  if ((pointer)local_608._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_608 + 8),
               (VkCommandPool)local_608._0_8_);
  }
  if (local_620 != (long *)0x0) {
    (**(code **)(*local_620 + 8))();
  }
  if ((pointer)local_658._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(local_658 + 8),(VkImage)local_658._0_8_);
  }
  return local_618;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const InstanceInterface&	vki					= context.getInstanceInterface();
	const VkDevice				device				= context.getDevice();
	const VkPhysicalDevice		physDevice			= context.getPhysicalDevice();
	const VkQueue				queue				= context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&					allocator			= context.getDefaultAllocator();

	const VkImageUsageFlags		colorImageUsage		= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_SAMPLED_BIT;

	checkImageFormatRequirements(vki, physDevice, caseDef.numSamples, caseDef.colorFormat, colorImageUsage);

	{
		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::LogSection("Description", "")
			<< tcu::TestLog::Message << "Rendering to a multisampled image. Expecting all samples to be either a clear color or a primitive color." << tcu::TestLog::EndMessage
			<< tcu::TestLog::Message << "Sampling from the texture with texelFetch (OpImageFetch)." << tcu::TestLog::EndMessage
			<< tcu::TestLog::EndSection;
	}

	// Multisampled color image
	const Unique<VkImage>			colorImage		(makeImage(vk, device, caseDef.colorFormat, caseDef.renderSize, caseDef.numLayers, caseDef.numSamples, colorImageUsage));
	const UniquePtr<Allocation>		colorImageAlloc	(bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any));

	const Unique<VkCommandPool>		cmdPool			(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(makeCommandBuffer(vk, device, *cmdPool));

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
	};

	// Step 1: Render to texture
	{
		renderMultisampledImage(context, caseDef, *colorImage);
	}

	// Step 2: Sample texture
	{
		// Color image view
		const VkImageViewType			colorImageViewType	= (caseDef.numLayers == 1 ? VK_IMAGE_VIEW_TYPE_2D : VK_IMAGE_VIEW_TYPE_2D_ARRAY);
		const Unique<VkImageView>		colorImageView		(makeImageView(vk, device, *colorImage, colorImageViewType, caseDef.colorFormat, makeColorSubresourceRange(0, caseDef.numLayers)));
		const Unique<VkSampler>			colorSampler		(makeSampler(vk, device));

		// Checksum image
		const VkFormat					checksumFormat		= VK_FORMAT_R32_SINT;
		const Unique<VkImage>			checksumImage		(makeImage(vk, device, checksumFormat, caseDef.renderSize, 1u, VK_SAMPLE_COUNT_1_BIT,
																	   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT));
		const UniquePtr<Allocation>		checksumImageAlloc	(bindImage(vk, device, allocator, *checksumImage, MemoryRequirement::Any));
		const Unique<VkImageView>		checksumImageView	(makeImageView(vk, device, *checksumImage, VK_IMAGE_VIEW_TYPE_2D, checksumFormat, makeColorSubresourceRange(0, 1)));

		// Checksum buffer (for host reading)
		const VkDeviceSize				checksumBufferSize	= caseDef.renderSize.x() * caseDef.renderSize.y() * tcu::getPixelSize(mapVkFormat(checksumFormat));
		const Unique<VkBuffer>			checksumBuffer		(makeBuffer(vk, device, checksumBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
		const UniquePtr<Allocation>		checksumBufferAlloc	(bindBuffer(vk, device, allocator, *checksumBuffer, MemoryRequirement::HostVisible));

		zeroBuffer(vk, device, *checksumBufferAlloc, checksumBufferSize);

		// Vertex buffer
		const std::vector<Vertex4RGBA>	vertices			= genFullQuadVertices();
		const VkDeviceSize				vertexBufferSize	= sizeInBytes(vertices);
		const Unique<VkBuffer>			vertexBuffer		(makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		const UniquePtr<Allocation>		vertexBufferAlloc	(bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible));

		{
			deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
			flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
		}

		// Descriptors
		// \note OpImageFetch doesn't use a sampler, but in GLSL texelFetch needs a sampler2D which translates to a combined image sampler in Vulkan.

		const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
			.addSingleSamplerBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, VK_SHADER_STAGE_FRAGMENT_BIT, &colorSampler.get())
			.build(vk, device));

		const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
			.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
			.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

		const Unique<VkDescriptorSet>	descriptorSet		(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
		const VkDescriptorImageInfo		imageDescriptorInfo	= makeDescriptorImageInfo(DE_NULL, *colorImageView, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL);

		DescriptorSetUpdateBuilder()
			.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, &imageDescriptorInfo)
			.update(vk, device);

		const Unique<VkShaderModule>	vertexModule	(createShaderModule		(vk, device, context.getBinaryCollection().get("sample_vert"), 0u));
		const Unique<VkShaderModule>	fragmentModule	(createShaderModule		(vk, device, context.getBinaryCollection().get("sample_frag"), 0u));
		const Unique<VkRenderPass>		renderPass		(makeSimpleRenderPass	(vk, device, checksumFormat));
		const Unique<VkFramebuffer>		framebuffer		(makeFramebuffer		(vk, device, *renderPass, 1u, &checksumImageView.get(),
																				 static_cast<deUint32>(caseDef.renderSize.x()),  static_cast<deUint32>(caseDef.renderSize.y())));
		const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout		(vk, device, *descriptorSetLayout));
		const std::vector<PipelineSp>	pipelines		(makeGraphicsPipelines	(vk, device, 1u, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
																				 caseDef.renderSize, VK_SAMPLE_COUNT_1_BIT, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP));

		beginCommandBuffer(vk, *cmdBuffer);

		// Prepare for sampling in the fragment shader
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_SHADER_READ_BIT,									// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,					// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*colorImage,												// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers),			// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}

		const VkClearValue clearValue = makeClearValueColorU32(0u, 0u, 0u, 0u);

		const VkRenderPassBeginInfo renderPassBeginInfo = {
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,							// VkStructureType         sType;
			DE_NULL,															// const void*             pNext;
			*renderPass,														// VkRenderPass            renderPass;
			*framebuffer,														// VkFramebuffer           framebuffer;
			renderArea,															// VkRect2D                renderArea;
			1u,																	// uint32_t                clearValueCount;
			&clearValue,														// const VkClearValue*     pClearValues;
		};
		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipelines.back());
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
		{
			const VkDeviceSize vertexBufferOffset = 0ull;
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
		}

		vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(vertices.size()), 1u, 0u, 0u);
		vk.cmdEndRenderPass(*cmdBuffer);

		// Prepare checksum image for copy
		{
			const VkImageMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,						// VkStructureType			sType;
					DE_NULL,													// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,						// VkAccessFlags			outputMask;
					VK_ACCESS_TRANSFER_READ_BIT,								// VkAccessFlags			inputMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,									// deUint32					destQueueFamilyIndex;
					*checksumImage,												// VkImage					image;
					makeColorSubresourceRange(0, 1),							// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers);
		}
		// Checksum image -> host buffer
		{
			const VkBufferImageCopy region =
			{
				0ull,																		// VkDeviceSize                bufferOffset;
				0u,																			// uint32_t                    bufferRowLength;
				0u,																			// uint32_t                    bufferImageHeight;
				makeColorSubresourceLayers(0, 1),											// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),														// VkOffset3D                  imageOffset;
				makeExtent3D(caseDef.renderSize.x(), caseDef.renderSize.y(), 1u),			// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *checksumImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *checksumBuffer, 1u, &region);
		}
		// Buffer write barrier
		{
			const VkBufferMemoryBarrier barriers[] =
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType    sType;
					DE_NULL,										// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,						// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// uint32_t           dstQueueFamilyIndex;
					*checksumBuffer,								// VkBuffer           buffer;
					0ull,											// VkDeviceSize       offset;
					checksumBufferSize,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(barriers), barriers, DE_NULL, 0u);
		}

		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify result

		{
			invalidateMappedMemoryRange(vk, device, checksumBufferAlloc->getMemory(), 0ull, checksumBufferSize);

			const tcu::ConstPixelBufferAccess access(mapVkFormat(checksumFormat), caseDef.renderSize.x(), caseDef.renderSize.y(), 1, checksumBufferAlloc->getHostPtr());
			const int numExpectedChecksum = getNumSamples(caseDef.numSamples) * caseDef.numLayers;

			for (int y = 0; y < caseDef.renderSize.y(); ++y)
			for (int x = 0; x < caseDef.renderSize.x(); ++x)
			{
				if (access.getPixelInt(x, y).x() != numExpectedChecksum)
					return tcu::TestStatus::fail("Some samples have incorrect color");
			}
		}
	}

	return tcu::TestStatus::pass("OK");
}